

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_extract.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type *psVar1;
  string *__s2;
  MappedFile *pMVar2;
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 auVar4 [8];
  bool bVar5;
  char cVar6;
  int iVar7;
  _Rb_tree_iterator<long> _Var8;
  undefined4 extraout_var;
  _Base_ptr p_Var9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RCX;
  ulong uVar10;
  int iVar11;
  _List _Var12;
  string *psVar13;
  undefined8 uVar14;
  pair<std::_Rb_tree_iterator<long>,_bool> pVar15;
  undefined1 auVar16 [16];
  path local_230;
  undefined1 local_208 [8];
  set<long,_std::less<long>,_std::allocator<long>_> extract_indices;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [8];
  string hed_filename;
  string mrg_filename;
  string nam_filename;
  string output_basename;
  undefined1 local_130 [8];
  anon_class_40_5_4793491c write_entry;
  string hed_raw;
  string nam_raw;
  undefined1 auStack_b8 [8];
  Nam nam;
  long local_98;
  shared_ptr<mg::fs::MappedFile> mrg_data;
  undefined1 local_78 [8];
  path output_dir;
  string *local_48;
  char *input_basename;
  unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> mrg;
  bool has_nam;
  
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&extract_indices;
  extract_indices._M_t._M_impl._0_4_ = 0;
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_48 = (string *)0x0;
  _Var12 = (_List)(1 < argc);
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  if (argc < 2) {
    output_dir._M_cmpts = (_List)0x0;
    output_dir._33_7_ = 0;
    mrg._M_t.super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>.
    _M_t.super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
    super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._0_4_ = 0;
    uVar14 = (string *)0x0;
  }
  else {
    iVar11 = 1;
    output_dir._M_cmpts = (_List)0x0;
    output_dir._33_7_ = 0;
    mrg._M_t.super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>.
    _M_t.super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
    super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._0_4_ = 0;
    psVar13 = (string *)0x0;
    do {
      __s2 = (string *)
             (&(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_vptr__Sp_counted_base)[iVar11];
      in_RCX._M_pi = mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      iVar7 = strcmp("-i",(char *)__s2);
      _Var3 = mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      if (iVar7 == 0) {
        iVar7 = iVar11 + 1;
        if (argc <= iVar7) {
          main_cold_2();
          goto LAB_00104dda;
        }
        output_dir._M_cmpts = _Var12;
        output_basename.field_2._8_8_ = psVar13;
        local_130 = (undefined1  [8])
                    strtol((char *)(&(mrg_data.
                                      super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base)[iVar7],
                           (char **)local_78,0);
        auVar4 = local_78;
        pMVar2 = (MappedFile *)(&(_Var3._M_pi)->_vptr__Sp_counted_base)[iVar7];
        if (local_78 == (undefined1  [8])pMVar2) {
          iVar7 = fprintf(_stderr,"Failed to parse index \'%s\'\n",pMVar2);
          _Var8._M_node = (_Base_ptr)CONCAT44(extraout_var,iVar7);
          mrg._M_t.
          super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>._M_t
          .super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
          super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._0_4_ = -1;
          _Var12 = output_dir._M_cmpts;
        }
        else {
          pVar15 = std::
                   _Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
                   _M_emplace_unique<long&>
                             ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                               *)local_208,(long *)local_130);
          _Var8 = pVar15.first._M_node;
          _Var12 = output_dir._M_cmpts;
          iVar11 = iVar7;
        }
        output_dir._33_7_ = SUB87((ulong)_Var8._M_node >> 8,0);
        output_dir._M_cmpts = (_List)0x1;
        uVar14 = output_basename.field_2._8_8_;
        __s2 = local_48;
        if (auVar4 == (undefined1  [8])pMVar2) break;
      }
      else {
        uVar14 = psVar13;
        if ((local_48 != (string *)0x0) &&
           (uVar14 = __s2, __s2 = local_48, psVar13 != (string *)0x0)) {
          main_cold_1();
LAB_00104dda:
          mrg._M_t.
          super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>._M_t
          .super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
          super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._0_4_ = -1;
          uVar14 = psVar13;
          break;
        }
      }
      local_48 = __s2;
      iVar11 = iVar11 + 1;
      _Var12 = (_List)(iVar11 < argc);
      psVar13 = (string *)uVar14;
    } while (iVar11 < argc);
  }
  iVar11 = (int)mrg._M_t.
                super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                ._M_t.
                super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl;
  if (((byte)_Var12 & 1) == 0) {
    if (local_48 == (string *)0x0) {
      main_cold_4();
      iVar11 = -1;
    }
    else {
      psVar1 = &output_dir._M_pathname._M_string_length;
      local_78 = (undefined1  [8])psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"%s.hed","");
      mg::string::format<char_const*>
                ((string *)local_1b8,(string *)local_78,local_48,(char *)in_RCX._M_pi);
      if (local_78 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_78,output_dir._M_pathname._M_string_length + 1);
      }
      local_78 = (undefined1  [8])psVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"%s.mrg","");
      mg::string::format<char_const*>
                ((string *)((long)&hed_filename.field_2 + 8),(string *)local_78,local_48,
                 (char *)in_RCX._M_pi);
      if (local_78 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_78,output_dir._M_pathname._M_string_length + 1);
      }
      write_entry.output_dir = (path *)&hed_raw._M_string_length;
      hed_raw._M_dataplus._M_p = (pointer)0x0;
      hed_raw._M_string_length._0_1_ = 0;
      bVar5 = mg::fs::read_file((char *)local_1b8,(string *)&write_entry.output_dir);
      iVar11 = -1;
      if (bVar5) {
        mg::fs::MappedFile::open(local_78,(int)hed_filename.field_2._8_8_);
        std::__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>,void>
                  ((__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2> *)&local_98,
                   (unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
                   local_78);
        std::unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_>::~unique_ptr
                  ((unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
                   local_78);
        if (local_98 != 0) {
          local_78 = (undefined1  [8])psVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"%s.nam","");
          mg::string::format<char_const*>
                    ((string *)((long)&mrg_filename.field_2 + 8),(string *)local_78,local_48,
                     (char *)in_RCX._M_pi);
          if (local_78 != (undefined1  [8])psVar1) {
            operator_delete((void *)local_78,output_dir._M_pathname._M_string_length + 1);
          }
          hed_raw.field_2._8_8_ = &nam_raw._M_string_length;
          nam_raw._M_dataplus._M_p = (pointer)0x0;
          nam_raw._M_string_length._0_1_ = 0;
          nam.names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_b8 = (undefined1  [8])0x0;
          nam.names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          bVar5 = mg::fs::read_file((char *)mrg_filename.field_2._8_8_,
                                    (string *)((long)&hed_raw.field_2 + 8));
          if (bVar5) {
            mrg._M_t.
            super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>.
            _M_t.
            super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
            .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._7_1_ =
                 mg::data::nam_read((string *)((long)&hed_raw.field_2 + 8),(Nam *)auStack_b8);
          }
          else {
            mrg._M_t.
            super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>.
            _M_t.
            super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
            .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._7_1_ = false;
          }
          this = mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          nam_raw.field_2._8_8_ = local_98;
          if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_size =
                   (int)(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_size + 1;
              UNLOCK();
            }
            else {
              *(int *)&(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_size =
                   (int)(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_size + 1;
            }
          }
          mg::data::MappedMrg::parse
                    ((MappedMrg *)&input_basename,(string *)&write_entry.output_dir,
                     (shared_ptr<mg::fs::MappedFile> *)((long)&nam_raw.field_2 + 8));
          if (this != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
          }
          if (input_basename != (char *)0x0) {
            if ((mrg._M_t.
                 super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                 .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._7_1_ == '\x01')
               && (*(long *)(input_basename + 0x18) - *(long *)(input_basename + 0x10) >> 3 !=
                   (long)nam.names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)auStack_b8 >> 5)) {
              fprintf(_stderr,"MRG entry count (%lu) does not match NAM entry count (%lu)\n");
            }
            else {
              local_130 = (undefined1  [8])".";
              if ((string *)uVar14 != (string *)0x0) {
                local_130 = (undefined1  [8])uVar14;
              }
              std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                        ((path *)local_78,(char **)local_130,auto_format);
              cVar6 = std::filesystem::status((path *)local_78);
              if (((cVar6 == -1) || (cVar6 == '\0')) &&
                 (cVar6 = std::filesystem::create_directories((path *)local_78), cVar6 == '\0')) {
                main_cold_3();
              }
              else {
                std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                          (&local_230,(char **)&local_48,auto_format);
                auVar16 = std::filesystem::__cxx11::path::_M_find_extension();
                if (auVar16._8_8_ == 0 || auVar16._0_8_ == 0) {
                  std::filesystem::__cxx11::path::path((path *)local_130);
                }
                else {
                  std::__cxx11::string::substr
                            ((ulong)&extract_indices._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,auVar16._0_8_);
                  std::filesystem::__cxx11::path::path
                            ((path *)local_130,
                             (string_type *)
                             &extract_indices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             auto_format);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)extract_indices._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                      &local_1c8) {
                    operator_delete((void *)extract_indices._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count,local_1c8._M_allocated_capacity + 1);
                  }
                }
                psVar13 = (string *)((long)&nam_filename.field_2 + 8);
                nam_filename.field_2._8_8_ = &output_basename._M_string_length;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)psVar13,local_130,
                           (string *)
                           ((long)local_130 + (long)&(write_entry.output_basename)->_M_dataplus));
                std::filesystem::__cxx11::path::~path((path *)local_130);
                std::filesystem::__cxx11::path::~path(&local_230);
                write_entry.output_basename =
                     (string *)
                     ((long)&mrg._M_t.
                             super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
                             .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl + 7);
                write_entry.has_nam = (bool *)auStack_b8;
                local_130 = (undefined1  [8])psVar13;
                write_entry.nam = (Nam *)&input_basename;
                write_entry.mrg =
                     (unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> *)
                     local_78;
                if ((output_dir._32_8_ & 1) == 0) {
                  if (*(long *)(input_basename + 0x18) != *(long *)(input_basename + 0x10)) {
                    uVar10 = 0;
                    do {
                      main::anon_class_40_5_4793491c::operator()
                                ((anon_class_40_5_4793491c *)local_130,(uint)uVar10);
                      uVar10 = uVar10 + 1;
                    } while (uVar10 < (ulong)(*(long *)(input_basename + 0x18) -
                                              *(long *)(input_basename + 0x10) >> 3));
                  }
                }
                else if (extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                         (_Rb_tree_node_base *)&extract_indices) {
                  p_Var9 = extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  do {
                    main::anon_class_40_5_4793491c::operator()
                              ((anon_class_40_5_4793491c *)local_130,p_Var9[1]._M_color);
                    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
                  } while (p_Var9 != (_Rb_tree_node_base *)&extract_indices);
                }
                if ((size_type *)nam_filename.field_2._8_8_ != &output_basename._M_string_length) {
                  operator_delete((void *)nam_filename.field_2._8_8_,
                                  output_basename._M_string_length + 1);
                }
                iVar11 = 0;
              }
              std::filesystem::__cxx11::path::~path((path *)local_78);
            }
          }
          if (input_basename != (char *)0x0) {
            std::default_delete<mg::data::MappedMrg>::operator()
                      ((default_delete<mg::data::MappedMrg> *)&input_basename,
                       (MappedMrg *)input_basename);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_b8);
          if ((size_type *)hed_raw.field_2._8_8_ != &nam_raw._M_string_length) {
            operator_delete((void *)hed_raw.field_2._8_8_,
                            CONCAT71(nam_raw._M_string_length._1_7_,
                                     (undefined1)nam_raw._M_string_length) + 1);
          }
          if ((size_type *)mrg_filename.field_2._8_8_ != &nam_filename._M_string_length) {
            operator_delete((void *)mrg_filename.field_2._8_8_,nam_filename._M_string_length + 1);
          }
        }
        if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
      }
      if (write_entry.output_dir != (path *)&hed_raw._M_string_length) {
        operator_delete(write_entry.output_dir,
                        CONCAT71(hed_raw._M_string_length._1_7_,(undefined1)hed_raw._M_string_length
                                ) + 1);
      }
      if ((size_type *)hed_filename.field_2._8_8_ != &mrg_filename._M_string_length) {
        operator_delete((void *)hed_filename.field_2._8_8_,mrg_filename._M_string_length + 1);
      }
      if (local_1b8 != (undefined1  [8])&hed_filename._M_string_length) {
        operator_delete((void *)local_1b8,hed_filename._M_string_length + 1);
      }
    }
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             local_208);
  return iVar11;
}

Assistant:

int main(int argc, char **argv) {
  // Parse args
  bool targeted_extract = false;
  std::set<long> extract_indices;

  const char *input_basename = nullptr;
  const char *output_path = nullptr;
  for (int i = 1; i < argc; i++) {
    if (!strcmp("-i", argv[i])) {
      // Check it is followed by an index
      if (i + 1 >= argc) {
        fprintf(stderr, "Missing argument for -i\n");
        return -1;
      }

      // Entry specifier
      targeted_extract = true;
      char *endptr;
      long extract_idx = strtol(argv[i + 1], &endptr, 0);
      if (endptr == argv[i + 1]) {
        fprintf(stderr, "Failed to parse index '%s'\n", argv[i + 1]);
        return -1;
      }

      // Add to extract set
      extract_indices.emplace(extract_idx);

      // Skip arg and loop
      i++;
      continue;
    }

    // Basename?
    if (input_basename == nullptr) {
      input_basename = argv[i];
      continue;
    }

    // Output dir?
    if (output_path == nullptr) {
      output_path = argv[i];
      continue;
    }

    // Invalid state
    usage(argv[0]);
    return -1;
  }

  // Check args are OK
  if (input_basename == nullptr) {
    usage(argv[0]);
    return -1;
  }

  // Test for input files
  const std::string hed_filename = mg::string::format("%s.hed", input_basename);
  const std::string mrg_filename = mg::string::format("%s.mrg", input_basename);

  // Read raw data for hed file
  std::string hed_raw;
  if (!mg::fs::read_file(hed_filename.c_str(), hed_raw)) {
    return -1;
  }

  // Try and map the mrg data
  std::shared_ptr<mg::fs::MappedFile> mrg_data =
      mg::fs::MappedFile::open(mrg_filename.c_str());
  if (mrg_data == nullptr) {
    return -1;
  }

  // Try and read the NAM table as well. If we can't that's OK
  const std::string nam_filename = mg::string::format("%s.nam", input_basename);
  std::string nam_raw;
  mg::data::Nam nam;
  const bool has_nam = mg::fs::read_file(nam_filename.c_str(), nam_raw) &&
                       nam_read(nam_raw, nam);

  // Parse the MRG data
  auto mrg = mg::data::MappedMrg::parse(hed_raw, mrg_data);
  if (mrg == nullptr) {
    return -1;
  }

  // If we have a NAM and MRG, assert that the filename count matches the entry
  // count
  if (has_nam && mrg->entries().size() != nam.names.size()) {
    fprintf(stderr,
            "MRG entry count (%lu) does not match NAM entry count (%lu)\n",
            mrg->entries().size(), nam.names.size());
    return -1;
  }

  // Ensure output dir exists
  std::filesystem::path output_dir = output_path ? output_path : ".";
  if (!std::filesystem::exists(output_dir) &&
      !std::filesystem::create_directories(output_dir)) {
    fprintf(stderr, "Failed to create output path '%s'\n", output_dir.c_str());
    return -1;
  }

  // Utility method to write an index to an output file
  const std::string output_basename =
      std::filesystem::path(input_basename).stem();
  auto write_entry = [&](unsigned index) -> int {
    std::string output_filename =
        mg::string::format("%s.%08lu.dat", output_basename.c_str(), index);

    // If we have a name table, use that name as well
    if (has_nam) {
      output_filename =
          mg::string::format("%s.%08lu.%s.dat", output_basename.c_str(), index,
                             nam.names[index].c_str());
    }

    auto entry_data = mrg->entry_data(index);
    std::filesystem::path output_path = output_dir;
    output_path.append(output_filename);
    if (!mg::fs::write_file(output_path.c_str(), entry_data)) {
      return -1;
    }
    fprintf(stderr, "Wrote %lu bytes to %s\n", entry_data.size(),
            output_path.c_str());

    return 0;
  };

  // Iterate the mrg entries and emit
  if (!targeted_extract) {
    for (std::vector<std::string>::size_type i = 0; i < mrg->entries().size();
         i++) {
      write_entry(i);
    }
  } else {
    for (long i : extract_indices) {
      write_entry(i);
    }
  }

  return 0;
}